

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portal.cpp
# Opt level: O1

void P_UpdatePortal(FLinePortal *port)

{
  uint uVar1;
  line_t *plVar2;
  vertex_t *pvVar3;
  double dVar4;
  double dVar5;
  byte bVar6;
  line_t *plVar7;
  double dVar8;
  
  plVar2 = port->mDestination;
  if (plVar2 == (line_t *)0x0) {
    port->mFlags = '\0';
    SetRotation(port);
    return;
  }
  uVar1 = plVar2->portalindex;
  if (uVar1 < linePortals.Count) {
    plVar7 = linePortals.Array[uVar1].mDestination;
  }
  else {
    plVar7 = (line_t *)0x0;
  }
  if (plVar7 == port->mOrigin) {
    port->mFlags = port->mDefFlags;
    if (port->mType == '\x03') {
      if (linePortals.Array[uVar1].mType != '\x03') {
        port->mType = '\x02';
        SetRotation(port);
        return;
      }
      dVar4 = (plVar2->v2->p).X;
      pvVar3 = port->mOrigin->v1;
      dVar5 = (pvVar3->p).X;
      (port->mDisplacement).Y = (plVar2->v2->p).Y - (pvVar3->p).Y;
      (port->mDisplacement).X = dVar4 - dVar5;
      SetRotation(port);
      return;
    }
  }
  else {
    bVar6 = port->mDefFlags & 0xf7;
    port->mFlags = bVar6;
    if (port->mType == '\x03') {
      port->mType = '\x01';
      port->mDefFlags = bVar6;
      SetRotation(port);
      return;
    }
  }
  if ((port != (FLinePortal *)0x0) && (plVar2 = port->mDestination, plVar2 != (line_t *)0x0)) {
    if (port->mType == '\x03') {
      port->mCosRot = 1.0;
      (port->mAngleDiff).Degrees = 0.0;
      port->mSinRot = 0.0;
    }
    else {
      plVar7 = port->mOrigin;
      dVar4 = c_atan2((plVar2->delta).Y,(plVar2->delta).X);
      dVar5 = c_atan2((plVar7->delta).Y,(plVar7->delta).X);
      dVar8 = (dVar4 * 57.29577951308232 - dVar5 * 57.29577951308232) + 180.0;
      dVar4 = dVar8 * 0.017453292519943295;
      dVar5 = c_sin(dVar4);
      port->mSinRot = dVar5;
      dVar4 = c_cos(dVar4);
      port->mCosRot = dVar4;
      (port->mAngleDiff).Degrees = dVar8;
      if (((plVar7->sidedef[0]->Flags & 0x40) == 0) && ((plVar2->sidedef[0]->Flags & 0x40) == 0)) {
        port->mFlags = port->mFlags & 0xef;
      }
      else {
        port->mFlags = port->mFlags | 0x10;
      }
    }
  }
  return;
}

Assistant:

void P_UpdatePortal(FLinePortal *port)
{
	if (port->mDestination == NULL)
	{
		// Portal has no destination: switch it off
		port->mFlags = 0;
	}
	else if (port->mDestination->getPortalDestination() != port->mOrigin)
	{
		//portal doesn't link back. This will be a simple teleporter portal.
		port->mFlags = port->mDefFlags & ~PORTF_INTERACTIVE;
		if (port->mType == PORTT_LINKED)
		{
			// this is illegal. Demote the type to TELEPORT
			port->mType = PORTT_TELEPORT;
			port->mDefFlags &= ~PORTF_INTERACTIVE;
		}
	}
	else
	{
		port->mFlags = port->mDefFlags;
		if (port->mType == PORTT_LINKED)
		{
			if (linePortals[port->mDestination->portalindex].mType != PORTT_LINKED)
			{
				port->mType = PORTT_INTERACTIVE;	// linked portals must be two-way.
			}
			else
			{
				port->mDisplacement = port->mDestination->v2->fPos() - port->mOrigin->v1->fPos();
			}
		}
 	}

	// Cache the angle between the two linedefs, for rotating.
	SetRotation(port);
}